

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O3

CURLcode Curl_is_connected(connectdata *conn,int sockindex,_Bool *connected)

{
  SessionHandle *data;
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  bool bVar4;
  _Bool _Var5;
  uint uVar6;
  CURLcode CVar7;
  CURLcode CVar8;
  long lVar9;
  int *piVar10;
  char *pcVar11;
  ulong uVar12;
  int error;
  char ipaddress [46];
  int local_98;
  int local_94;
  timeval local_90;
  _Bool *local_80;
  long local_78;
  ulong local_70;
  char local_68 [56];
  
  data = conn->data;
  local_98 = 0;
  *connected = false;
  if ((conn->bits).tcpconnect[sockindex] == true) {
    *connected = true;
LAB_0054db9c:
    CVar8 = CURLE_OK;
  }
  else {
    local_94 = sockindex;
    local_90 = curlx_tvnow();
    local_70 = Curl_timeleft(data,&local_90,true);
    if ((long)local_70 < 0) {
      Curl_failf(data,"Connection time-out");
      CVar8 = CURLE_OPERATION_TIMEDOUT;
    }
    else {
      uVar12 = 0;
      CVar7 = CURLE_OK;
      local_80 = connected;
      local_78 = (long)sockindex;
      bVar4 = true;
      do {
        bVar2 = bVar4;
        if (conn->tempsock[uVar12] != -1) {
          uVar6 = Curl_socket_check(-1,-1,conn->tempsock[uVar12],0);
          if (uVar6 == 2) {
            _Var5 = verifyconnect(conn->tempsock[uVar12],&local_98);
            lVar9 = local_78;
            if (_Var5) {
              conn->sock[local_78] = conn->tempsock[uVar12];
              conn->ip_addr = conn->tempaddr[uVar12];
              conn->tempsock[uVar12] = -1;
              if (conn->tempsock[uVar12 ^ 1] != -1) {
                Curl_closesocket(conn,conn->tempsock[uVar12 ^ 1]);
                conn->tempsock[uVar12 ^ 1] = -1;
              }
              CVar8 = Curl_connected_proxy(conn,local_94);
              if (CVar8 != CURLE_OK) {
                return CVar8;
              }
              (conn->bits).tcpconnect[lVar9] = true;
              *local_80 = true;
              if (local_94 == 0) {
                Curl_pgrsTime(data,TIMER_CONNECT);
              }
              Curl_updateconninfo(conn,conn->sock[lVar9]);
              Curl_verboseconnect(conn);
              goto LAB_0054db9c;
            }
            Curl_infof(data,"Connection failed\n");
          }
          else if (uVar6 == 0) {
            lVar9 = curlx_tvdiff(local_90,conn->connecttime);
            if (conn->timeoutms_per_addr <= lVar9) {
              Curl_infof(data,"After %ldms connect time, move on!\n");
              local_98 = 0x6e;
            }
            if (((bVar2) && (conn->tempaddr[1] == (Curl_addrinfo *)0x0)) &&
               (lVar9 = curlx_tvdiff(local_90,conn->connecttime), 199 < lVar9)) {
              trynextip(conn,local_94,1);
            }
          }
          else if ((uVar6 & 4) != 0) {
            verifyconnect(conn->tempsock[uVar12],&local_98);
          }
          iVar3 = local_98;
          if (local_98 != 0) {
            (data->state).os_errno = local_98;
            piVar10 = __errno_location();
            *piVar10 = iVar3;
            if (conn->tempaddr[uVar12] != (Curl_addrinfo *)0x0) {
              Curl_printable_address(conn->tempaddr[uVar12],local_68,0x2e);
              lVar9 = conn->port;
              pcVar11 = Curl_strerror(conn,local_98);
              Curl_infof(data,"connect to %s port %ld failed: %s\n",local_68,lVar9,pcVar11);
              conn->timeoutms_per_addr =
                   local_70 >> (conn->tempaddr[uVar12]->ai_next != (Curl_addrinfo *)0x0);
              CVar7 = trynextip(conn,local_94,(int)uVar12);
            }
          }
        }
        uVar12 = 1;
        bVar4 = false;
      } while (bVar2);
      CVar8 = CURLE_OK;
      if (CVar7 != CURLE_OK) {
        if ((conn->tempaddr[1] == (Curl_addrinfo *)0x0) &&
           (CVar8 = trynextip(conn,local_94,1), CVar8 == CURLE_OK)) {
          return CURLE_OK;
        }
        uVar1 = *(undefined8 *)(conn->primary_ip + (ulong)(conn->bits).proxy * 0x20 + -0x3c);
        lVar9 = conn->port;
        pcVar11 = Curl_strerror(conn,local_98);
        Curl_failf(data,"Failed to connect to %s port %ld: %s",uVar1,lVar9,pcVar11);
        CVar8 = CVar7;
      }
    }
  }
  return CVar8;
}

Assistant:

CURLcode Curl_is_connected(struct connectdata *conn,
                           int sockindex,
                           bool *connected)
{
  struct SessionHandle *data = conn->data;
  CURLcode code = CURLE_OK;
  long allow;
  int error = 0;
  struct timeval now;
  int result;
  int i;

  DEBUGASSERT(sockindex >= FIRSTSOCKET && sockindex <= SECONDARYSOCKET);

  *connected = FALSE; /* a very negative world view is best */

  if(conn->bits.tcpconnect[sockindex]) {
    /* we are connected already! */
    *connected = TRUE;
    return CURLE_OK;
  }

  now = Curl_tvnow();

  /* figure out how long time we have left to connect */
  allow = Curl_timeleft(data, &now, TRUE);

  if(allow < 0) {
    /* time-out, bail out, go home */
    failf(data, "Connection time-out");
    return CURLE_OPERATION_TIMEDOUT;
  }

  for(i=0; i<2; i++) {
    if(conn->tempsock[i] == CURL_SOCKET_BAD)
      continue;

#ifdef mpeix
    /* Call this function once now, and ignore the results. We do this to
       "clear" the error state on the socket so that we can later read it
       reliably. This is reported necessary on the MPE/iX operating system. */
    (void)verifyconnect(conn->tempsock[i], NULL);
#endif

    /* check socket for connect */
    result = Curl_socket_ready(CURL_SOCKET_BAD, conn->tempsock[i], 0);

    if(result == 0) { /* no connection yet */
      if(curlx_tvdiff(now, conn->connecttime) >= conn->timeoutms_per_addr) {
        infof(data, "After %ldms connect time, move on!\n",
              conn->timeoutms_per_addr);
        error = ETIMEDOUT;
      }

      /* should we try another protocol family? */
      if(i == 0 && conn->tempaddr[1] == NULL &&
         curlx_tvdiff(now, conn->connecttime) >= HAPPY_EYEBALLS_TIMEOUT) {
        trynextip(conn, sockindex, 1);
      }
    }
    else if(result == CURL_CSELECT_OUT) {
      if(verifyconnect(conn->tempsock[i], &error)) {
        /* we are connected with TCP, awesome! */
        int other = i ^ 1;

        /* use this socket from now on */
        conn->sock[sockindex] = conn->tempsock[i];
        conn->ip_addr = conn->tempaddr[i];
        conn->tempsock[i] = CURL_SOCKET_BAD;

        /* close the other socket, if open */
        if(conn->tempsock[other] != CURL_SOCKET_BAD) {
          Curl_closesocket(conn, conn->tempsock[other]);
          conn->tempsock[other] = CURL_SOCKET_BAD;
        }

        /* see if we need to do any proxy magic first once we connected */
        code = Curl_connected_proxy(conn, sockindex);
        if(code)
          return code;

        conn->bits.tcpconnect[sockindex] = TRUE;

        *connected = TRUE;
        if(sockindex == FIRSTSOCKET)
          Curl_pgrsTime(data, TIMER_CONNECT); /* connect done */
        Curl_updateconninfo(conn, conn->sock[sockindex]);
        Curl_verboseconnect(conn);

        return CURLE_OK;
      }
      else
        infof(data, "Connection failed\n");
    }
    else if(result & CURL_CSELECT_ERR)
      (void)verifyconnect(conn->tempsock[i], &error);

    /*
     * The connection failed here, we should attempt to connect to the "next
     * address" for the given host. But first remember the latest error.
     */
    if(error) {
      char ipaddress[MAX_IPADR_LEN];
      data->state.os_errno = error;
      SET_SOCKERRNO(error);
      if(conn->tempaddr[i]) {
        Curl_printable_address(conn->tempaddr[i], ipaddress, MAX_IPADR_LEN);
        infof(data, "connect to %s port %ld failed: %s\n",
              ipaddress, conn->port, Curl_strerror(conn, error));

        conn->timeoutms_per_addr = conn->tempaddr[i]->ai_next == NULL ?
                                   allow : allow / 2;

        code = trynextip(conn, sockindex, i);
      }
    }
  }

  if(code) {
    /* no more addresses to try */

    /* if the first address family runs out of addresses to try before
       the happy eyeball timeout, go ahead and try the next family now */
    if(conn->tempaddr[1] == NULL) {
      int rc;
      rc = trynextip(conn, sockindex, 1);
      if(rc == CURLE_OK)
        return CURLE_OK;
    }

    failf(data, "Failed to connect to %s port %ld: %s",
          conn->bits.proxy?conn->proxy.name:conn->host.name,
          conn->port, Curl_strerror(conn, error));
  }

  return code;
}